

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplicationDifferentiationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Expression expression;
  Variable y;
  Variable x;
  Expression local_130;
  allocator local_111;
  Expression local_110;
  int local_f4;
  Variable local_f0;
  Variable local_d8;
  Expression local_c0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  Kandinsky::Variable::Variable(&local_d8);
  Kandinsky::Variable::Variable(&local_f0);
  (local_d8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_f0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_130,&local_d8,&local_f0);
  (*(local_130.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_110,
             local_130.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_d8);
  (**(local_110.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  std::__cxx11::string::string((string *)&local_28,"d(x * y)/dx != 2",(allocator *)&local_c0);
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 2.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  Kandinsky::Expression::~Expression(&local_110);
  Kandinsky::Expression::~Expression(&local_130);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_130,&local_d8,&local_f0);
  (*(local_130.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_110,
             local_130.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_f0);
  (**(local_110.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  std::__cxx11::string::string((string *)&local_48,"d(x * y)/dy != 3",(allocator *)&local_c0);
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 3.0) & 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  Kandinsky::Expression::~Expression(&local_110);
  Kandinsky::Expression::~Expression(&local_130);
  local_f4 = 4;
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_c0,&local_d8,&local_f0);
  Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>(&local_130,&local_f4,&local_c0);
  (*(local_130.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_110,
             local_130.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_d8);
  (**(local_110.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  std::__cxx11::string::string((string *)&local_68,"y = 2; d(4 * (x * y))/dx != 8",&local_111);
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_01 == 8.0) & 1),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  Kandinsky::Expression::~Expression(&local_110);
  Kandinsky::Expression::~Expression(&local_130);
  Kandinsky::Expression::~Expression(&local_c0);
  local_c0._vptr_Expression._0_4_ = 4;
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_130,&local_d8,&local_f0);
  Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>(&local_110,(int *)&local_c0,&local_130);
  Kandinsky::Expression::~Expression(&local_130);
  (*(local_110.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_130,
             local_110.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_f0);
  (**(local_130.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  std::__cxx11::string::string
            ((string *)&local_88,"x = 3; d(4 * (x * y))/dy != 12",(allocator *)&local_c0);
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_02 == 12.0) & 1),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  Kandinsky::Expression::~Expression(&local_130);
  (local_d8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       5.0;
  (*(local_110.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_130,
             local_110.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_f0);
  (**(local_130.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  std::__cxx11::string::string
            ((string *)&local_a8,"x = 5; d(4 * (x * y))/dy != 20",(allocator *)&local_c0);
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_03 == 20.0) & 1),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  Kandinsky::Expression::~Expression(&local_130);
  Kandinsky::Expression::~Expression(&local_110);
  Kandinsky::Variable::~Variable(&local_f0);
  Kandinsky::Variable::~Variable(&local_d8);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * y).differentiate(x).evaluate() == 2, "d(x * y)/dx != 2");
    assertOrExit((x * y).differentiate(y).evaluate() == 3, "d(x * y)/dy != 3");
    assertOrExit((4 * (x * y)).differentiate(x).evaluate() == 8, "y = 2; d(4 * (x * y))/dx != 8");
    Expression expression(4 * (x * y));
    assertOrExit(expression.differentiate(y).evaluate() == 12, "x = 3; d(4 * (x * y))/dy != 12");
    x.setValue(5);
    assertOrExit(expression.differentiate(y).evaluate() == 20, "x = 5; d(4 * (x * y))/dy != 20");
    return 0;
}